

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

rtr_bgpsec *
rtr_bgpsec_new(uint8_t alg,uint8_t safi,uint16_t afi,uint32_t my_as,uint32_t target_as,
              rtr_bgpsec_nlri *nlri)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_bgpsec *bgpsec;
  rtr_bgpsec_nlri *nlri_local;
  uint32_t target_as_local;
  uint32_t my_as_local;
  uint16_t afi_local;
  uint8_t safi_local;
  uint8_t alg_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _my_as_local = (rtr_bgpsec *)lrtr_malloc(0x28);
  if (_my_as_local == (rtr_bgpsec *)0x0) {
    _my_as_local = (rtr_bgpsec *)0x0;
  }
  else {
    _my_as_local->alg = alg;
    _my_as_local->safi = safi;
    _my_as_local->afi = afi;
    _my_as_local->my_as = my_as;
    _my_as_local->target_as = target_as;
    _my_as_local->nlri = nlri;
    _my_as_local->path_len = '\0';
    _my_as_local->path = (rtr_secure_path_seg *)0x0;
    _my_as_local->sigs_len = 0;
    _my_as_local->sigs = (rtr_signature_seg *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _my_as_local;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_bgpsec *rtr_bgpsec_new(uint8_t alg, uint8_t safi, uint16_t afi, uint32_t my_as, uint32_t target_as,
				  struct rtr_bgpsec_nlri *nlri)
{
	struct rtr_bgpsec *bgpsec = lrtr_malloc(sizeof(struct rtr_bgpsec));

	if (!bgpsec)
		return NULL;

	bgpsec->alg = alg;
	bgpsec->safi = safi;
	bgpsec->afi = afi;
	bgpsec->my_as = my_as;
	bgpsec->target_as = target_as;
	bgpsec->nlri = nlri;
	bgpsec->path_len = 0;
	bgpsec->path = NULL;
	bgpsec->sigs_len = 0;
	bgpsec->sigs = NULL;

	return bgpsec;
}